

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlNodeParseContentInternal
              (xmlDoc *doc,xmlNodePtr parent,xmlChar *value,int len,xmlNodePtr *listPtr)

{
  byte bVar1;
  int iVar2;
  xmlBufPtr buf;
  xmlEntityPtr parent_00;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  uint uVar5;
  byte *pbVar6;
  int val;
  xmlNodePtr pxVar7;
  long lVar8;
  uint uVar9;
  xmlNodePtr pxVar10;
  bool bVar11;
  xmlChar buffer [10];
  xmlNodePtr local_68;
  xmlNodePtr local_58;
  xmlNodePtr local_48;
  xmlChar local_3a [10];
  
  if (listPtr != (xmlNodePtr *)0x0) {
    *listPtr = (xmlNodePtr)0x0;
  }
  uVar9 = 0x7fffffff;
  if ((uint)len < 0x7fffffff) {
    uVar9 = len;
  }
  if ((value == (xmlChar *)0x0) || (*value == '\0')) {
    local_58 = (xmlNodePtr)0x0;
    pxVar7 = (xmlNodePtr)0x0;
    goto LAB_0014ce87;
  }
  buf = xmlBufCreate(0x32);
  if (buf == (xmlBufPtr)0x0) {
    return -1;
  }
  if (len != 0) {
    local_68 = (xmlNodePtr)0x0;
    local_58 = (xmlNodePtr)0x0;
    pbVar6 = value;
LAB_0014cac9:
    if (*value == 0x26) {
      if (((long)value - (long)pbVar6 != 0) &&
         (iVar2 = xmlBufAdd(buf,pbVar6,(long)value - (long)pbVar6), iVar2 != 0)) goto LAB_0014cfb3;
      if (uVar9 < 3) {
        if (uVar9 != 1) {
          if (value[1] == 0x23) {
            pbVar6 = value + 2;
            iVar2 = uVar9 - 2;
LAB_0014cb4a:
            bVar11 = false;
            val = 0;
            goto LAB_0014ccf2;
          }
          if (uVar9 == 2) goto LAB_0014cb5b;
        }
        goto LAB_0014cf0e;
      }
      if (value[1] == 0x23) {
        if (value[2] == 0x78) {
          pbVar6 = value + 3;
          if (uVar9 == 3) {
            iVar2 = 0;
            goto LAB_0014cb4a;
          }
          lVar8 = (ulong)(uVar9 - 4) + 4;
          val = 0;
          iVar2 = uVar9 - 3;
          do {
            bVar1 = *pbVar6;
            uVar9 = (uint)bVar1;
            if (uVar9 == 0x3b) goto LAB_0014ccec;
            if ((byte)(bVar1 - 0x30) < 10) {
              val = val * 0x10 + uVar9 + -0x30;
            }
            else if ((byte)(bVar1 + 0x9f) < 6) {
              val = val * 0x10 + uVar9 + -0x57;
            }
            else {
              if (5 < (byte)(bVar1 + 0xbf)) goto LAB_0014ccea;
              val = val * 0x10 + uVar9 + -0x37;
            }
            if (0x10ffff < val) {
              val = 0x110000;
            }
            pbVar6 = pbVar6 + 1;
            bVar11 = 1 < iVar2;
            iVar2 = iVar2 + -1;
          } while (bVar11);
        }
        else {
          lVar8 = (ulong)(uVar9 - 3) + 3;
          pbVar6 = value + 2;
          val = 0;
          iVar2 = uVar9 - 2;
          do {
            bVar1 = *pbVar6;
            uVar9 = (uint)bVar1;
            if (bVar1 == 0x3b) goto LAB_0014ccec;
            if (9 < (byte)(bVar1 - 0x30)) goto LAB_0014ccea;
            val = uVar9 + val * 10 + -0x30;
            if (0x10ffff < val) {
              val = 0x110000;
            }
            pbVar6 = pbVar6 + 1;
            bVar11 = 1 < iVar2;
            iVar2 = iVar2 + -1;
          } while (bVar11);
        }
        pbVar6 = value + lVar8;
        iVar2 = 0;
        goto LAB_0014ccec;
      }
LAB_0014cb5b:
      pbVar6 = value + 1;
      lVar8 = 0;
      while( true ) {
        if (value[lVar8 + 1] == 0) {
          value = value + lVar8 + 1;
          goto LAB_0014cef1;
        }
        if (value[lVar8 + 1] == 0x3b) break;
        lVar8 = lVar8 + 1;
        if (uVar9 - 1 == (int)lVar8) {
          value = value + (ulong)(uVar9 - 2) + 2;
          goto LAB_0014cef1;
        }
      }
      if (lVar8 != 0) {
        pxVar4 = xmlStrndup(pbVar6,(int)lVar8);
        if (pxVar4 == (xmlChar *)0x0) {
LAB_0014cfd5:
          xmlBufFree(buf);
          goto LAB_0014cfbd;
        }
        parent_00 = xmlGetDocEntity(doc,pxVar4);
        if ((parent_00 == (xmlEntityPtr)0x0) || (parent_00->etype != XML_INTERNAL_PREDEFINED_ENTITY)
           ) {
          iVar2 = xmlBufIsEmpty(buf);
          if (iVar2 == 0) {
            local_48 = xmlNewText((xmlChar *)0x0);
            if (local_48 == (xmlNodePtr)0x0) goto LAB_0014cfe1;
            local_48->doc = doc;
            pxVar3 = xmlBufDetach(buf);
            local_48->content = pxVar3;
            local_48->parent = parent;
            pxVar10 = local_48;
            if (local_58 != (xmlNodePtr)0x0) {
              local_58->next = local_48;
              local_48->prev = local_58;
              pxVar10 = local_68;
            }
          }
          else {
            local_48 = local_58;
            pxVar10 = local_68;
          }
          local_68 = pxVar10;
          if (((parent_00 != (xmlEntityPtr)0x0) && ((parent_00->flags & 9U) == 0)) &&
             (parent_00->content != (xmlChar *)0x0)) {
            parent_00->flags = parent_00->flags | 8;
            iVar2 = xmlNodeParseContentInternal
                              (doc,(xmlNodePtr)parent_00,parent_00->content,-1,(xmlNodePtr *)0x0);
            uVar5 = parent_00->flags & 0xfffffff7;
            parent_00->flags = uVar5;
            if (iVar2 < 0) goto LAB_0014cfe1;
            parent_00->flags = uVar5 | 1;
          }
          local_58 = xmlNewEntityRef(doc,pxVar4);
          if (local_58 == (xmlNodePtr)0x0) goto LAB_0014cfd5;
          local_58->parent = parent;
          local_58->last = (_xmlNode *)parent_00;
          if (parent_00 != (xmlEntityPtr)0x0) {
            local_58->children = (_xmlNode *)parent_00;
            local_58->content = parent_00->content;
          }
          if (local_48 == (xmlNodePtr)0x0) {
            pxVar4 = (xmlChar *)0x0;
            local_68 = local_58;
          }
          else {
            local_48->next = local_58;
            local_58->prev = local_48;
            pxVar4 = (xmlChar *)0x0;
          }
        }
        else {
          iVar2 = xmlBufCat(buf,parent_00->content);
          if (iVar2 != 0) {
LAB_0014cfe1:
            xmlBufFree(buf);
            (*xmlFree)(pxVar4);
            goto LAB_0014cfbd;
          }
        }
        (*xmlFree)(pxVar4);
      }
      value = value + lVar8 + 2;
      uVar9 = (uVar9 - (int)lVar8) - 2;
      pbVar6 = value;
      goto LAB_0014ce77;
    }
    if (*value != 0) {
      value = value + 1;
      uVar9 = uVar9 - 1;
      goto LAB_0014ce77;
    }
    goto LAB_0014cef1;
  }
  iVar2 = xmlBufIsEmpty(buf);
  if (iVar2 == 0) {
    local_68 = (xmlNodePtr)0x0;
    pxVar10 = (xmlNodePtr)0x0;
    goto LAB_0014cf58;
  }
LAB_0014cf2b:
  local_58 = xmlNewText("");
  if (local_58 == (xmlNodePtr)0x0) {
    local_68 = (xmlNodePtr)0x0;
    goto LAB_0014cfb3;
  }
  local_58->doc = doc;
  local_58->parent = parent;
  pxVar7 = local_58;
LAB_0014cf94:
  xmlBufFree(buf);
LAB_0014ce87:
  if (parent != (xmlNodePtr)0x0) {
    if (parent->children != (xmlNodePtr)0x0) {
      xmlFreeNodeList(parent->children);
    }
    parent->children = pxVar7;
    parent->last = local_58;
  }
  if (listPtr != (xmlNodePtr *)0x0) {
    *listPtr = pxVar7;
  }
  return 0;
LAB_0014ccea:
  val = 0;
LAB_0014ccec:
  bVar11 = uVar9 == 0x3b;
LAB_0014ccf2:
  value = pbVar6 + bVar11;
  uVar9 = iVar2 - (uint)bVar11;
  pbVar6 = value;
  if (val != 0) {
    if (0x10ffff < val) {
      val = 0xfffd;
    }
    iVar2 = xmlCopyCharMultiByte(local_3a,val);
    local_3a[iVar2] = '\0';
    iVar2 = xmlBufCat(buf,local_3a);
    if (iVar2 != 0) goto LAB_0014cfb3;
  }
LAB_0014ce77:
  if ((int)uVar9 < 1) goto LAB_0014cef1;
  goto LAB_0014cac9;
LAB_0014cef1:
  if (((long)value - (long)pbVar6 != 0) &&
     (iVar2 = xmlBufAdd(buf,pbVar6,(long)value - (long)pbVar6), iVar2 != 0)) goto LAB_0014cfb3;
LAB_0014cf0e:
  iVar2 = xmlBufIsEmpty(buf);
  pxVar10 = local_58;
  if (iVar2 == 0) {
LAB_0014cf58:
    local_58 = xmlNewText((xmlChar *)0x0);
    if (local_58 == (xmlNodePtr)0x0) {
LAB_0014cfb3:
      xmlBufFree(buf);
LAB_0014cfbd:
      if (local_68 == (xmlNodePtr)0x0) {
        return -1;
      }
      xmlFreeNodeList(local_68);
      return -1;
    }
    local_58->doc = doc;
    local_58->parent = parent;
    pxVar4 = xmlBufDetach(buf);
    local_58->content = pxVar4;
    pxVar7 = local_58;
    if (pxVar10 != (xmlNodePtr)0x0) {
      pxVar10->next = local_58;
      local_58->prev = pxVar10;
      pxVar7 = local_68;
    }
  }
  else {
    pxVar7 = local_68;
    if (local_68 == (xmlNodePtr)0x0) goto LAB_0014cf2b;
  }
  goto LAB_0014cf94;
}

Assistant:

static int
xmlNodeParseContentInternal(const xmlDoc *doc, xmlNodePtr parent,
                            const xmlChar *value, int len,
                            xmlNodePtr *listPtr) {
    xmlNodePtr head = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val = NULL;
    const xmlChar *cur;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;
    int remaining;

    if (listPtr != NULL)
        *listPtr = NULL;

    if (len < 0)
        remaining = INT_MAX;
    else
        remaining = len;

    if ((value == NULL) || (value[0] == 0))
        goto done;

    cur = value;

    buf = xmlBufCreate(50);
    if (buf == NULL)
        return(-1);

    q = cur;
    while ((remaining > 0) && (*cur != 0)) {
	if (cur[0] == '&') {
	    int charval = 0;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	        q = cur;
	    }

	    if ((remaining > 2) && (cur[1] == '#') && (cur[2] == 'x')) {
	        int tmp = 0;

		cur += 3;
                remaining -= 3;
		while ((remaining > 0) && ((tmp = *cur) != ';')) {
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			charval = 0;
			break;
		    }
                    if (charval > 0x110000)
                        charval = 0x110000;
		    cur++;
                    remaining--;
		}
		if (tmp == ';') {
		    cur++;
                    remaining--;
                }
		q = cur;
	    } else if ((remaining > 1) && (cur[1] == '#')) {
	        int tmp = 0;

		cur += 2;
                remaining -= 2;
		while ((remaining > 0) && ((tmp = *cur) != ';')) {
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			charval = 0;
			break;
		    }
                    if (charval > 0x110000)
                        charval = 0x110000;
		    cur++;
                    remaining--;
		}
		if (tmp == ';') {
		    cur++;
                    remaining--;
                }
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
                remaining--;
		q = cur;
		while ((remaining > 0) && (*cur != 0) && (*cur != ';')) {
                    cur++;
                    remaining--;
                }
		if ((remaining <= 0) || (*cur == 0))
		    break;
		if (cur != q) {
		    val = xmlStrndup(q, cur - q);
                    if (val == NULL)
                        goto out;
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
                        /*
                         * Predefined entities don't generate nodes
                         */
			if (xmlBufCat(buf, ent->content))
			    goto out;
		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    if (node == NULL)
				goto out;
			    node->content = xmlBufDetach(buf);
                            node->parent = parent;

			    if (last == NULL) {
				head = node;
			    } else {
                                last->next = node;
                                node->prev = last;
			    }
                            last = node;
			}

			if ((ent != NULL) &&
                            ((ent->flags & XML_ENT_PARSED) == 0) &&
                            ((ent->flags & XML_ENT_EXPANDING) == 0) &&
                            (ent->content != NULL)) {
                            int res;

                            ent->flags |= XML_ENT_EXPANDING;
                            res = xmlNodeParseContentInternal(doc,
                                    (xmlNodePtr) ent, ent->content, -1, NULL);
                            ent->flags &= ~XML_ENT_EXPANDING;
                            if (res < 0)
                                goto out;
                            ent->flags |= XML_ENT_PARSED;
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewEntityRef((xmlDocPtr) doc, val);
                        val = NULL;
			if (node == NULL)
			    goto out;
                        node->parent = parent;
                        node->last = (xmlNodePtr) ent;
                        if (ent != NULL) {
                            node->children = (xmlNodePtr) ent;
                            node->content = ent->content;
                        }

			if (last == NULL) {
			    head = node;
			} else {
                            last->next = node;
                            node->prev = last;
			}
                        last = node;
		    }
		    xmlFree(val);
                    val = NULL;
		}
		cur++;
                remaining--;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int l;

                if (charval >= 0x110000)
                    charval = 0xFFFD; /* replacement character */

		l = xmlCopyCharMultiByte(buffer, charval);
		buffer[l] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
	    }
	} else {
	    cur++;
            remaining--;
        }
    }

    if (cur != q) {
        /*
	 * Handle the last piece of text.
	 */
	if (xmlBufAdd(buf, q, cur - q))
	    goto out;
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
	if (node == NULL)
            goto out;
        node->parent = parent;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    head = node;
	} else {
            last->next = node;
            node->prev = last;
	}
        last = node;
    } else if (head == NULL) {
        head = xmlNewDocText(doc, BAD_CAST "");
        if (head == NULL)
            goto out;
        head->parent = parent;
        last = head;
    }

    xmlBufFree(buf);

done:
    if (parent != NULL) {
        if (parent->children != NULL)
            xmlFreeNodeList(parent->children);
        parent->children = head;
        parent->last = last;
    }

    if (listPtr != NULL)
        *listPtr = head;

    return(0);

out:
    xmlBufFree(buf);
    if (val != NULL)
        xmlFree(val);
    if (head != NULL)
        xmlFreeNodeList(head);
    return(-1);
}